

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall QRegularExpressionMatch::QRegularExpressionMatch(QRegularExpressionMatch *this)

{
  QStringView subject;
  void *pvVar1;
  QRegularExpressionMatchPrivate *pQVar2;
  QRegularExpressionMatchPrivate *in_RDI;
  long in_FS_OFFSET;
  MatchOption in_stack_ffffffffffffff7c;
  QString *in_stack_ffffffffffffff80;
  QRegularExpression *re;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 local_3c;
  QStringView local_38;
  QRegularExpression local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  pvVar1 = operator_new(0x60);
  matchOptions.i = (Int)((ulong)pQVar2 >> 0x20);
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
  QRegularExpression::QRegularExpression((QRegularExpression *)in_RDI);
  re = local_28;
  QString::QString((QString *)0x72fd7f);
  QStringView::QStringView(&local_38);
  QFlags<QRegularExpression::MatchOption>::QFlags
            ((QFlags<QRegularExpression::MatchOption> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c);
  subject.m_data._0_4_ = uVar3;
  subject.m_size = (qsizetype)pvVar1;
  subject.m_data._4_4_ = in_stack_ffffffffffffffac;
  QRegularExpressionMatchPrivate::QRegularExpressionMatchPrivate
            (in_RDI,re,in_stack_ffffffffffffff80,subject,in_stack_ffffffffffffff7c,
             (MatchOptions)matchOptions.i);
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)
             in_stack_ffffffffffffff80,
             (QRegularExpressionMatchPrivate *)CONCAT44(in_stack_ffffffffffffff7c,local_3c));
  QString::~QString((QString *)0x72fde2);
  QRegularExpression::~QRegularExpression((QRegularExpression *)0x72fdec);
  pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)0x72fdf6);
  pQVar2->isValid = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch::QRegularExpressionMatch()
    : d(new QRegularExpressionMatchPrivate(QRegularExpression(),
                                           QString(),
                                           QStringView(),
                                           QRegularExpression::NoMatch,
                                           QRegularExpression::NoMatchOption))
{
    d->isValid = true;
}